

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O0

int menu_bar_x_offset_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Widget_Look local_1c;
  int border;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  _border = self;
  pAVar2 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_1c,pAVar2);
  pAVar2 = Am_Object::Get(_border,0x1c8,0);
  self_local._4_4_ = Am_Value::operator_cast_to_int(pAVar2);
  bVar1 = Am_Widget_Look::operator==(&local_1c,&Am_MOTIF_LOOK);
  if (bVar1) {
    self_local._4_4_ = self_local._4_4_ + 3;
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, menu_bar_x_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  int border = self.Get(Am_MENU_BORDER);
  if (look == Am_MOTIF_LOOK)
    return border + 3;
  else
    return border;
}